

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBlockMemoryAllocator.cpp
# Opt level: O3

void __thiscall
Diligent::FixedBlockMemoryAllocator::MemoryPage::dbgVerifyAddress(MemoryPage *this,void *pBlockAddr)

{
  FixedBlockMemoryAllocator *pFVar1;
  ulong uVar2;
  ulong uVar3;
  string msg;
  string local_38;
  
  uVar2 = (long)pBlockAddr - (long)this->m_pPageStart;
  pFVar1 = this->m_pOwnerAllocator;
  uVar3 = pFVar1->m_BlockSize;
  if (uVar2 % uVar3 != 0) {
    FormatString<char[16]>(&local_38,(char (*) [16])"Invalid address");
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"dbgVerifyAddress",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/FixedBlockMemoryAllocator.cpp"
               ,0x5d);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    pFVar1 = this->m_pOwnerAllocator;
    uVar3 = pFVar1->m_BlockSize;
  }
  if (pFVar1->m_NumBlocksInPage <= (uint)(uVar2 / uVar3)) {
    FormatString<char[20]>(&local_38,(char (*) [20])"Invalid block index");
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"dbgVerifyAddress",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/FixedBlockMemoryAllocator.cpp"
               ,0x5f);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void FixedBlockMemoryAllocator::MemoryPage::dbgVerifyAddress(const void* pBlockAddr) const
{
    size_t Delta = reinterpret_cast<const Uint8*>(pBlockAddr) - reinterpret_cast<Uint8*>(m_pPageStart);
    VERIFY(Delta % m_pOwnerAllocator->m_BlockSize == 0, "Invalid address");
    Uint32 BlockIndex = static_cast<Uint32>(Delta / m_pOwnerAllocator->m_BlockSize);
    VERIFY(BlockIndex < m_pOwnerAllocator->m_NumBlocksInPage, "Invalid block index");
}